

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ArgMinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_argmin(NeuralNetworkLayer *this)

{
  ArgMinLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x3fc) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3fc;
    this_00 = (ArgMinLayerParams *)operator_new(0x20);
    ArgMinLayerParams::ArgMinLayerParams(this_00);
    (this->layer_).argmin_ = this_00;
  }
  return (ArgMinLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgMinLayerParams* NeuralNetworkLayer::mutable_argmin() {
  if (!has_argmin()) {
    clear_layer();
    set_has_argmin();
    layer_.argmin_ = new ::CoreML::Specification::ArgMinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.argMin)
  return layer_.argmin_;
}